

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall xLearn::CSVParser::~CSVParser(CSVParser *this)

{
  void *in_RDI;
  
  ~CSVParser((CSVParser *)0x20ddb8);
  operator_delete(in_RDI);
  return;
}

Assistant:

~CSVParser() { }